

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O3

void __thiscall
QTransposeProxyModelPrivate::onLayoutChanged
          (QTransposeProxyModelPrivate *this,QList<QPersistentModelIndex> *parents,
          LayoutChangeHint hint)

{
  QObject *this_00;
  LayoutChangeHint _t2;
  QPersistentModelIndex *persistIdx;
  QPersistentModelIndex *pQVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 local_b0 [24];
  QPersistentModelIndex local_98;
  QModelIndex local_90;
  Data *local_78;
  QPersistentModelIndex *pQStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QList<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (QModelIndex *)0x0;
  local_58.d.size = 0;
  QList<QModelIndex>::reserve(&local_58,(this->layoutChangePersistentIndexes).d.size);
  lVar2 = (this->layoutChangePersistentIndexes).d.size;
  if (lVar2 != 0) {
    pQVar1 = (this->layoutChangePersistentIndexes).d.ptr;
    lVar2 = lVar2 << 3;
    do {
      QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar1);
      (*this_00->_vptr_QObject[0x33])((QModelIndex *)&local_78,this_00,&local_90);
      QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                ((QMovableArrayOps<QModelIndex> *)&local_58,local_58.d.size,(QModelIndex *)&local_78
                );
      QList<QModelIndex>::end(&local_58);
      pQVar1 = pQVar1 + 1;
      lVar2 = lVar2 + -8;
    } while (lVar2 != 0);
  }
  QAbstractItemModel::changePersistentIndexList
            ((QAbstractItemModel *)this_00,&this->layoutChangeProxyIndexes,&local_58);
  QList<QModelIndex>::clear(&this->layoutChangeProxyIndexes);
  QList<QPersistentModelIndex>::clear(&this->layoutChangePersistentIndexes);
  local_78 = (Data *)0x0;
  pQStack_70 = (QPersistentModelIndex *)0x0;
  local_68.ptr = (QAbstractItemModel *)0x0;
  QList<QPersistentModelIndex>::reserve((QList<QPersistentModelIndex> *)&local_78,(parents->d).size)
  ;
  lVar2 = (parents->d).size;
  if (lVar2 != 0) {
    pQVar1 = (parents->d).ptr;
    lVar2 = lVar2 << 3;
    do {
      QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar1);
      (*this_00->_vptr_QObject[0x33])(&local_90,this_00,local_b0);
      QPersistentModelIndex::QPersistentModelIndex(&local_98,&local_90);
      QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                ((QMovableArrayOps<QPersistentModelIndex> *)&local_78,(qsizetype)local_68.ptr,
                 &local_98);
      QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_78);
      QPersistentModelIndex::~QPersistentModelIndex(&local_98);
      pQVar1 = pQVar1 + 1;
      lVar2 = lVar2 + -8;
    } while (lVar2 != 0);
  }
  _t2 = HorizontalSortHint;
  if (hint != VerticalSortHint) {
    _t2 = (uint)(hint == HorizontalSortHint);
  }
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)this_00,(QList<QPersistentModelIndex> *)&local_78,_t2);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_78);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTransposeProxyModelPrivate::onLayoutChanged(const QList<QPersistentModelIndex> &parents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QTransposeProxyModel);
    Q_ASSERT(layoutChangeProxyIndexes.size() == layoutChangePersistentIndexes.size());
    QModelIndexList toList;
    toList.reserve(layoutChangePersistentIndexes.size());
    for (const QPersistentModelIndex &persistIdx : std::as_const(layoutChangePersistentIndexes))
        toList << q->mapFromSource(persistIdx);
    q->changePersistentIndexList(layoutChangeProxyIndexes, toList);
    layoutChangeProxyIndexes.clear();
    layoutChangePersistentIndexes.clear();
    QList<QPersistentModelIndex> proxyParents;
    proxyParents.reserve(parents.size());
    for (const QPersistentModelIndex &srcParent : parents)
        proxyParents << q->mapFromSource(srcParent);
    QAbstractItemModel::LayoutChangeHint proxyHint = QAbstractItemModel::NoLayoutChangeHint;
    if (hint == QAbstractItemModel::VerticalSortHint)
        proxyHint = QAbstractItemModel::HorizontalSortHint;
    else if (hint == QAbstractItemModel::HorizontalSortHint)
        proxyHint = QAbstractItemModel::VerticalSortHint;
    emit q->layoutChanged(proxyParents, proxyHint);
}